

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O2

void SSL_CTX_set_client_CA_list(SSL_CTX *ctx,stack_st_X509_NAME *name_list)

{
  bssl::check_ssl_ctx_x509_method((SSL_CTX *)ctx);
  (*(code *)ctx->cipher_list_by_id[4].stack.data)(ctx);
  set_client_CA_list((UniquePtr<struct_stack_st_CRYPTO_BUFFER> *)&ctx->extra_certs,
                     (stack_st_X509_NAME *)name_list,
                     (CRYPTO_BUFFER_POOL *)ctx->next_proto_select_cb_arg);
  sk_X509_NAME_pop_free((stack_st_X509_NAME *)name_list,X509_NAME_free);
  return;
}

Assistant:

static void set_client_CA_list(UniquePtr<STACK_OF(CRYPTO_BUFFER)> *ca_list,
                               const STACK_OF(X509_NAME) *name_list,
                               CRYPTO_BUFFER_POOL *pool) {
  UniquePtr<STACK_OF(CRYPTO_BUFFER)> buffers(sk_CRYPTO_BUFFER_new_null());
  if (!buffers) {
    return;
  }

  for (X509_NAME *name : name_list) {
    uint8_t *outp = NULL;
    int len = i2d_X509_NAME(name, &outp);
    if (len < 0) {
      return;
    }

    UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new(outp, len, pool));
    OPENSSL_free(outp);
    if (!buffer || !PushToStack(buffers.get(), std::move(buffer))) {
      return;
    }
  }

  *ca_list = std::move(buffers);
}